

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::extract_features(search *sch,uint32_t idx,multi_ex *ec)

{
  long *plVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  example_predict *peVar4;
  v_array<unsigned_int> *pvVar5;
  int iVar6;
  uint uVar8;
  uint64_t mask;
  example *peVar9;
  undefined4 uVar10;
  uint32_t *puVar11;
  int *piVar12;
  uint64_t offset;
  features *this;
  ulong uVar13;
  long lVar14;
  uint64_t multiplier;
  size_t j;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  float new_weight;
  size_t new_count;
  float local_74;
  ulong local_70;
  ulong local_68;
  vw *local_60;
  example *local_58;
  v_array<unsigned_int> *local_50;
  int *local_48;
  int *local_40;
  size_t local_38;
  uint uVar7;
  
  local_60 = Search::search::get_vw_pointer_unsafe(sch);
  plVar1 = (long *)sch->task_data;
  puVar2 = (undefined8 *)*plVar1;
  puVar2[0xd14] = 0;
  *(undefined4 *)((long)puVar2 + 0x68b4) = 0;
  pbVar3 = (byte *)puVar2[1];
  for (pbVar15 = (byte *)*puVar2; pbVar15 != pbVar3; pbVar15 = pbVar15 + 1) {
    features::clear((features *)(puVar2 + (ulong)*pbVar15 * 0xd + 4));
  }
  mask = Search::search::get_mask(sch);
  puVar11 = &(local_60->weights).dense_weights._stride_shift;
  if ((local_60->weights).sparse != false) {
    puVar11 = &(local_60->weights).sparse_weights._stride_shift;
  }
  multiplier = (ulong)local_60->wpp << ((byte)*puVar11 & 0x3f);
  local_40 = (int *)plVar1[0x13];
  local_48 = (int *)plVar1[0x14];
  if (local_40 == local_48) {
    uVar8 = 0;
  }
  else {
    uVar8 = local_48[-1];
  }
  local_50 = (v_array<unsigned_int> *)(plVar1 + 0x1f);
  local_58 = (example *)*plVar1;
  local_68 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  plVar1[0x55] = 0;
  plVar1[0x56] = 0;
  plVar1[0x53] = 0;
  plVar1[0x54] = 0;
  plVar1[0x51] = 0;
  plVar1[0x52] = 0;
  plVar1[0x4f] = 0;
  plVar1[0x50] = 0;
  plVar1[0x4d] = 0;
  plVar1[0x4e] = 0;
  plVar1[0x4b] = 0;
  plVar1[0x4c] = 0;
  plVar1[0x57] = 0;
  uVar13 = 0;
  piVar12 = local_48;
  do {
    piVar12 = piVar12 + -1;
    if ((uVar13 < (ulong)((long)local_48 - (long)local_40 >> 2)) && (*piVar12 != 0)) {
      peVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[*piVar12 - 1];
    }
    else {
      peVar9 = (example *)0x0;
    }
    plVar1[uVar13 + 0x4b] = (long)peVar9;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  local_70 = (ulong)idx;
  lVar14 = 0;
  do {
    if ((local_70 - 1) + lVar14 < local_68) {
      peVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[local_70 + lVar14 + -1];
    }
    else {
      peVar9 = (example *)0x0;
    }
    plVar1[lVar14 + 0x4e] = (long)peVar9;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  uVar13 = (ulong)uVar8;
  lVar14 = -0x20;
  do {
    if ((uVar8 != 0 && local_40 != local_48) &&
       (iVar6 = *(int *)(*(long *)((long)plVar1 + lVar14 * 4 + 600) + uVar13 * 4), iVar6 != 0)) {
      *(example **)((long)plVar1 + lVar14 + 0x2a8) =
           (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[iVar6 - 1];
    }
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0);
  lVar14 = -0x10;
  do {
    if ((local_68 < local_70) ||
       (iVar6 = *(int *)(*(long *)((long)plVar1 + lVar14 * 4 + 0x218) + local_70 * 4), iVar6 == 0))
    {
      peVar9 = (example *)0x0;
    }
    else {
      peVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar6 - 1];
    }
    *(example **)((long)plVar1 + lVar14 + 0x2b8) = peVar9;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0);
  if ((((ulong)((long)local_48 - (long)local_40) < 5) || ((ulong)(uint)local_48[-2] == 0)) ||
     (iVar6 = *(int *)(plVar1[0x3b] + (ulong)(uint)local_48[-2] * 4), iVar6 == 0)) {
    peVar9 = (example *)0x0;
  }
  else {
    peVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[iVar6 - 1];
  }
  plVar1[0x57] = (long)peVar9;
  uVar16 = multiplier * 0x1a1d5191;
  this = (local_58->super_example_predict).feature_space + 0x42;
  lVar14 = 0x4b;
  offset = 0;
  do {
    if ((example *)plVar1[lVar14] == (example *)0x0) {
      features::push_back(this,1.0,uVar16 & mask);
    }
    else {
      add_all_features(local_58,(example *)plVar1[lVar14],(char)lVar14 + 0xf7,mask,multiplier,offset
                       ,false);
    }
    pvVar5 = local_50;
    lVar14 = lVar14 + 1;
    uVar16 = uVar16 + multiplier * 0x5416d;
    offset = offset + 0x5416d;
    this = this + 1;
  } while (lVar14 != 0x58);
  v_array<unsigned_int>::resize(local_50,10);
  if (local_40 == local_48) {
    *pvVar5->_begin = 0;
    pvVar5->_begin[1] = 1;
    uVar8 = 1;
  }
  else {
    iVar6 = 1;
    if (local_70 <= local_68) {
      uVar7 = 5;
      if (idx - uVar8 < 5) {
        uVar7 = idx - uVar8;
      }
      iVar6 = uVar7 + 2;
    }
    *(int *)plVar1[0x1f] = iVar6;
    uVar8 = *(uint *)(plVar1[0x33] + uVar13 * 4);
    if (4 < uVar8) {
      uVar8 = 5;
    }
    *(uint *)(plVar1[0x1f] + 4) = uVar8 + 1;
    uVar7 = *(uint *)(plVar1[0x37] + uVar13 * 4);
    uVar8 = 5;
    if (uVar7 < 5) {
      uVar8 = uVar7;
    }
    uVar8 = uVar8 + 1;
  }
  pvVar5->_begin[2] = uVar8;
  uVar8 = 1;
  if (local_70 <= local_68) {
    uVar7 = *(uint *)(plVar1[0x33] + local_70 * 4);
    uVar8 = 5;
    if (uVar7 < 5) {
      uVar8 = uVar7;
    }
    uVar8 = uVar8 + 1;
  }
  pvVar5->_begin[3] = uVar8;
  lVar14 = 0x3b;
  do {
    uVar10 = 0xf;
    if ((local_40 != local_48) &&
       (uVar16 = (ulong)*(uint *)(plVar1[lVar14] + uVar13 * 4), uVar16 != 0)) {
      uVar10 = *(undefined4 *)(plVar1[0x1b] + uVar16 * 4);
    }
    *(undefined4 *)((long)pvVar5->_begin + lVar14 + -0x2b) = uVar10;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x4b);
  lVar14 = 0x3b;
  do {
    uVar10 = 0xf;
    if ((local_70 <= local_68) &&
       (uVar13 = (ulong)*(uint *)(plVar1[lVar14] + local_70 * 4), uVar13 != 0)) {
      uVar10 = *(undefined4 *)(plVar1[0x1b] + uVar13 * 4);
    }
    *(undefined4 *)((long)pvVar5->_begin + lVar14 + -0x1b) = uVar10;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x43);
  peVar4 = &local_58->super_example_predict;
  lVar14 = 0x20d8e94;
  lVar18 = 0;
  lVar17 = 0;
  do {
    lVar14 = lVar14 + lVar18;
    features::push_back(peVar4->feature_space + 100,1.0,
                        ((ulong)local_50->_begin[lVar17] + lVar14) * multiplier & mask);
    lVar17 = lVar17 + 1;
    lVar18 = lVar18 + 0x3ff;
  } while (lVar17 != 10);
  peVar9 = (example *)*plVar1;
  pbVar15 = (peVar9->super_example_predict).indices._begin;
  pbVar3 = (peVar9->super_example_predict).indices._end;
  if (pbVar15 == pbVar3) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    do {
      uVar13 = uVar13 + ((long)(peVar9->super_example_predict).feature_space[*pbVar15].values._end -
                         (long)(peVar9->super_example_predict).feature_space[*pbVar15].values._begin
                        >> 2);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != pbVar3);
  }
  INTERACTIONS::eval_count_of_generated_ft(local_60,peVar9,&local_38,&local_74);
  *(size_t *)(*plVar1 + 0x68a0) = local_38 + uVar13;
  *(float *)(*plVar1 + 0x68b4) = (float)uVar13 + local_74;
  return;
}

Assistant:

void extract_features(Search::search &sch, uint32_t idx, multi_ex &ec)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = sch.get_task_data<task_data>();
  reset_ex(data->ex);
  uint64_t mask = sch.get_mask();
  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  v_array<uint32_t> &stack = data->stack, &tags = data->tags, *children = data->children, &temp = data->temp;
  example **ec_buf = data->ec_buf;
  example &ex = *(data->ex);

  size_t n = ec.size();
  bool empty = stack.empty();
  size_t last = empty ? 0 : stack.last();

  for (size_t i = 0; i < 13; i++) ec_buf[i] = nullptr;

  // feature based on the top three examples in stack ec_buf[0]: s1, ec_buf[1]: s2, ec_buf[2]: s3
  for (size_t i = 0; i < 3; i++)
    ec_buf[i] = (stack.size() > i && *(stack.end() - (i + 1)) != 0) ? ec[*(stack.end() - (i + 1)) - 1] : 0;

  // features based on examples in string buffer ec_buf[3]: b1, ec_buf[4]: b2, ec_buf[5]: b3
  for (size_t i = 3; i < 6; i++) ec_buf[i] = (idx + (i - 3) - 1 < n) ? ec[idx + i - 3 - 1] : 0;

  // features based on the leftmost and the rightmost children of the top element stack ec_buf[6]: sl1, ec_buf[7]: sl2,
  // ec_buf[8]: sr1, ec_buf[9]: sr2;
  for (size_t i = 6; i < 10; i++)
    if (!empty && last != 0 && children[i - 4][last] != 0)
      ec_buf[i] = ec[children[i - 4][last] - 1];

  // features based on leftmost children of the top element in bufer ec_buf[10]: bl1, ec_buf[11]: bl2
  for (size_t i = 10; i < 12; i++)
    ec_buf[i] = (idx <= n && children[i - 8][idx] != 0) ? ec[children[i - 8][idx] - 1] : 0;
  ec_buf[12] = (stack.size() > 1 && *(stack.end() - 2) != 0 && children[2][*(stack.end() - 2)] != 0)
      ? ec[children[2][*(stack.end() - 2)] - 1]
      : 0;

  // unigram features
  for (size_t i = 0; i < 13; i++)
  {
    uint64_t additional_offset = (uint64_t)(i * offset_const);
    if (!ec_buf[i])
      add_feature(ex, (uint64_t)438129041 + additional_offset, (unsigned char)((i + 1) + 'A'), mask, multiplier);
    else
      add_all_features(ex, *ec_buf[i], 'A' + (unsigned char)(i + 1), mask, multiplier, additional_offset, false);
  }

  // Other features
  temp.resize(10);
  temp[0] = empty ? 0 : (idx > n ? 1 : 2 + min(5, idx - (uint32_t)last));
  temp[1] = empty ? 1 : 1 + min(5, children[0][last]);
  temp[2] = empty ? 1 : 1 + min(5, children[1][last]);
  temp[3] = idx > n ? 1 : 1 + min(5, children[0][idx]);
  for (size_t i = 4; i < 8; i++) temp[i] = (!empty && children[i - 2][last] != 0) ? tags[children[i - 2][last]] : 15;
  for (size_t i = 8; i < 10; i++) temp[i] = (idx <= n && children[i - 6][idx] != 0) ? tags[children[i - 6][idx]] : 15;

  uint64_t additional_offset = val_namespace * offset_const;
  for (size_t j = 0; j < 10; j++)
  {
    additional_offset += j * 1023;
    add_feature(ex, temp[j] + additional_offset, val_namespace, mask, multiplier);
  }
  size_t count = 0;
  for (features fs : *data->ex)
  {
    fs.sum_feat_sq = (float)fs.size();
    count += fs.size();
  }

  size_t new_count;
  float new_weight;
  INTERACTIONS::eval_count_of_generated_ft(all, *data->ex, new_count, new_weight);

  data->ex->num_features = count + new_count;
  data->ex->total_sum_feat_sq = (float)count + new_weight;
}